

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O3

void testMultiScanlinePartThreading(string *tempDir)

{
  pointer pcVar1;
  size_t sVar2;
  Header *pHVar3;
  Header *pHVar4;
  pointer pIVar5;
  _Alloc_hider _Var6;
  char cVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ostream *poVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ThreadPool *pTVar16;
  Task *pTVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  float *pfVar20;
  float *pfVar21;
  int *piVar22;
  ChannelList *this;
  ChannelList *pCVar23;
  pointer pOVar24;
  uint *puVar25;
  long *plVar26;
  undefined4 uVar27;
  uint uVar28;
  ulong uVar29;
  OutputPart *pOVar30;
  pointer pOVar31;
  ulong uVar32;
  bool bVar33;
  Header *this_00;
  vector<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_> *pvVar34;
  int y;
  char **ppcVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  MultiPartOutputFile *pMVar42;
  stringstream *this_01;
  FrameBuffer *pFVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar54;
  uint local_354;
  uint local_350;
  uint local_34c;
  vector<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_> parts;
  vector<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_> vStack_330;
  Header header;
  vector<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_> parts_1;
  string fn;
  InputPart part_1;
  MultiPartInputFile file_1;
  undefined8 uStack_280;
  OutputPart part;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  string *local_240;
  MultiPartOutputFile file;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  int local_208 [2];
  undefined8 uStack_200;
  char *local_1f8;
  long local_1f0;
  char *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  FrameBuffer frameBuffers [2];
  ios_base local_138 [264];
  
  local_240 = tempDir;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing the two threads reading/writing on two-scanline-part file",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar8 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar8);
  local_208[0] = -0x80000000;
  local_208[1] = 0x80000000;
  uStack_200._0_4_ = 0x80000000;
  uStack_200._4_4_ = 0x80000000;
  local_34c = 0;
  do {
    uVar28 = 0;
    do {
      fn._M_dataplus._M_p = (pointer)&fn.field_2;
      local_350 = local_34c;
      pcVar1 = (local_240->_M_dataplus)._M_p;
      local_354 = uVar28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fn,pcVar1,pcVar1 + local_240->_M_string_length);
      std::__cxx11::string::append((char *)&fn);
      lVar10 = 0x10;
      do {
        *(undefined1 **)((long)local_208 + lVar10) = (undefined1 *)((long)&local_1f8 + lVar10);
        *(undefined8 *)((long)&uStack_200 + lVar10) = 0;
        *(undefined1 *)((long)&local_1f8 + lVar10) = 0;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x50);
      puVar25 = &local_350;
      ppcVar35 = &local_1f8;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        if ((ulong)*puVar25 < 3) {
          std::__cxx11::string::_M_replace
                    ((ulong)ppcVar35,0,ppcVar35[1],
                     (ulong)(&DAT_001c65c4 + *(int *)(&DAT_001c65c4 + (ulong)*puVar25 * 4)));
        }
        puVar25 = &local_354;
        ppcVar35 = &local_1d8;
        bVar44 = false;
      } while (bVar33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part 1: ",8);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_1f8,local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," scanline part, ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"part 2: ",8);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_1d8,local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," scanline part. ",0x10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers ",0x13);
      std::ostream::flush();
      pHVar4 = DAT_001f2c50;
      pHVar3 = (anonymous_namespace)::headers;
      this_00 = (anonymous_namespace)::headers;
      if (DAT_001f2c50 != (anonymous_namespace)::headers) {
        do {
          Imf_3_2::Header::~Header(this_00);
          this_00 = this_00 + 0x38;
        } while (this_00 != pHVar4);
        DAT_001f2c50 = pHVar3;
      }
      iVar8 = 0;
      puVar25 = &local_350;
      this_01 = (stringstream *)frameBuffers;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        frameBuffers[0]._map._M_t._M_impl._0_8_ = 0;
        Imf_3_2::Header::Header
                  (&header,0xc5,0x107,1.0,(Vec2 *)this_01,1.0,INCREASING_Y,ZIP_COMPRESSION);
        uVar9 = *puVar25;
        std::__cxx11::stringstream::stringstream(this_01);
        std::ostream::operator<<
                  (&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   iVar8);
        std::__cxx11::stringbuf::str();
        Imf_3_2::Header::setName((string *)&header);
        if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&parts.
                      super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(parts.
                          super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)(parts.
                                  super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (uVar9 == 0) {
          pcVar12 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,UINT,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar12,(Channel *)"UINT");
        }
        else if (uVar9 == 1) {
          pcVar12 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,FLOAT,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar12,(Channel *)"FLOAT");
        }
        else if (uVar9 == 2) {
          pcVar12 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,HALF,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar12,(Channel *)"HALF");
        }
        Imf_3_2::Header::setType((string *)&header);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                   &(anonymous_namespace)::headers,&header);
        std::__cxx11::stringstream::~stringstream(this_01);
        std::ios_base::~ios_base(local_138);
        Imf_3_2::Header::~Header(&header);
        iVar8 = 1;
        puVar25 = &local_354;
        bVar44 = false;
      } while (bVar33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing files ",0xe)
      ;
      std::ostream::flush();
      pcVar13 = (char *)operator_new__(0x3298c);
      uVar9 = 1;
      uVar29 = 0;
      lVar10 = 0;
      pcVar12 = pcVar13;
      do {
        lVar36 = 1;
        iVar8 = (int)uVar29;
        auVar47 = _DAT_001bcae0;
        uVar39 = uVar9;
        do {
          if (SUB164(auVar47 ^ _DAT_001bcaf0,4) == local_208[0] &&
              SUB164(auVar47 ^ _DAT_001bcaf0,0) < -0x7fffff3b) {
            *(int *)(pcVar12 + lVar36 * 4 + -4) = (int)uVar29 + (int)(uVar29 / 0x801) * -0x801;
            *(uint *)(pcVar12 + lVar36 * 4) = uVar39 % 0x801;
          }
          lVar41 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 2;
          auVar47._8_8_ = lVar41 + 2;
          uVar39 = uVar39 + 2;
          lVar36 = lVar36 + 2;
          uVar29 = (ulong)((int)uVar29 + 2);
        } while (lVar36 != 199);
        lVar10 = lVar10 + 1;
        uVar9 = uVar9 + 0xc5;
        pcVar12 = pcVar12 + 0x314;
        uVar29 = (ulong)(iVar8 + 0xc5);
      } while (lVar10 != 0x107);
      pcVar14 = (char *)operator_new__(0x194c6);
      testMultiScanlinePartThreading();
      pcVar15 = (char *)operator_new__(0x3298c);
      uVar9 = 1;
      uVar39 = 0;
      lVar10 = 0;
      pcVar12 = pcVar15;
      do {
        lVar36 = 1;
        auVar48 = _DAT_001bcae0;
        uVar40 = uVar9;
        uVar37 = uVar39;
        do {
          if (SUB164(auVar48 ^ _DAT_001bcaf0,4) == local_208[0] &&
              SUB164(auVar48 ^ _DAT_001bcaf0,0) < -0x7fffff3b) {
            *(float *)(pcVar12 + lVar36 * 4 + -4) = (float)(uVar37 % 0x801);
            *(float *)(pcVar12 + lVar36 * 4) = (float)(uVar40 % 0x801);
          }
          lVar41 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 2;
          auVar48._8_8_ = lVar41 + 2;
          uVar40 = uVar40 + 2;
          lVar36 = lVar36 + 2;
          uVar37 = uVar37 + 2;
        } while (lVar36 != 199);
        lVar10 = lVar10 + 1;
        uVar9 = uVar9 + 0xc5;
        pcVar12 = pcVar12 + 0x314;
        uVar39 = uVar39 + 0xc5;
      } while (lVar10 != 0x107);
      remove(fn._M_dataplus._M_p);
      _Var6 = fn._M_dataplus;
      pHVar4 = DAT_001f2c50;
      pHVar3 = (anonymous_namespace)::headers;
      iVar8 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                (&file,_Var6._M_p,pHVar3,
                 (int)((ulong)((long)pHVar4 - (long)pHVar3) >> 3) * -0x49249249,false,iVar8);
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar10 = 0;
      do {
        lVar36 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar10;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar10
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar10) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar10) = lVar36;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar10) = lVar36;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar10) = 0
        ;
        lVar10 = lVar10 + 0x30;
      } while (lVar10 != 0x60);
      iVar8 = 0;
      puVar25 = &local_350;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        Imf_3_2::OutputPart::OutputPart(&part,&file,iVar8);
        uVar9 = *puVar25;
        if (uVar9 == 2) {
          Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar14,2,0x18a,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)this_01,(Slice *)"HALF");
        }
        else if (uVar9 == 1) {
          Imf_3_2::Slice::Slice((Slice *)&header,FLOAT,pcVar15,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)this_01,(Slice *)"FLOAT");
        }
        else if (uVar9 == 0) {
          Imf_3_2::Slice::Slice((Slice *)&header,UINT,pcVar13,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)this_01,(Slice *)"UINT");
        }
        Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part);
        if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_2::OutputPart,std::allocator<Imf_3_2::OutputPart>>::
          _M_realloc_insert<Imf_3_2::OutputPart_const&>
                    ((vector<Imf_3_2::OutputPart,std::allocator<Imf_3_2::OutputPart>> *)&parts,
                     (iterator)
                     parts.
                     super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part);
        }
        else {
          *(undefined8 *)
           parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part;
          parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        iVar8 = 1;
        this_01 = (stringstream *)(frameBuffers + 1);
        puVar25 = &local_354;
        bVar44 = false;
      } while (bVar33);
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar16 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar16,2);
      iVar8 = 0x1a;
      do {
        pTVar17 = (Task *)operator_new(0x20);
        pOVar31 = parts.
                  super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
        *(undefined ***)pTVar17 = &PTR__Task_001ed2f0;
        *(pointer *)(pTVar17 + 0x10) = pOVar31;
        *(undefined4 *)(pTVar17 + 0x18) = 10;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
        pTVar17 = (Task *)operator_new(0x20);
        pOVar31 = parts.
                  super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
        *(undefined ***)pTVar17 = &PTR__Task_001ed2f0;
        *(pointer *)(pTVar17 + 0x10) = pOVar31 + 8;
        *(undefined4 *)(pTVar17 + 0x18) = 10;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      pTVar17 = (Task *)operator_new(0x20);
      pOVar31 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
      *(undefined ***)pTVar17 = &PTR__Task_001ed2f0;
      *(pointer *)(pTVar17 + 0x10) = pOVar31;
      *(undefined4 *)(pTVar17 + 0x18) = 3;
      IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
      pTVar17 = (Task *)operator_new(0x20);
      pOVar31 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
      *(undefined ***)pTVar17 = &PTR__Task_001ed2f0;
      *(pointer *)(pTVar17 + 0x10) = pOVar31 + 8;
      *(undefined4 *)(pTVar17 + 0x18) = 3;
      IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
      (**(code **)(*(long *)pTVar16 + 8))(pTVar16);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar10 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar10));
        lVar10 = lVar10 + -0x30;
      } while (lVar10 != -0x30);
      if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts.
                        super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)parts.
                              super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts.
                              super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&file);
      operator_delete__(pcVar13);
      operator_delete__(pcVar15);
      operator_delete__(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking headers ",0x11);
      std::ostream::flush();
      _Var6 = fn._M_dataplus;
      iVar8 = Imf_3_2::globalThreadCount();
      uVar29 = 1;
      Imf_3_2::MultiPartInputFile::MultiPartInputFile(&file_1,_Var6._M_p,iVar8,true);
      iVar8 = Imf_3_2::MultiPartInputFile::parts();
      if (iVar8 != 2) {
        __assert_fail("file.parts () == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                      ,0x134,"void (anonymous namespace)::readFiles(int *, const std::string &)");
      }
      bVar44 = true;
      do {
        bVar33 = bVar44;
        uVar27 = (undefined4)uVar29;
        Imf_3_2::MultiPartInputFile::header((int)&file_1);
        puVar18 = (undefined8 *)Imf_3_2::Header::displayWindow();
        puVar19 = (undefined8 *)Imf_3_2::Header::displayWindow();
        iVar8 = -(uint)((int)*puVar19 == (int)*puVar18);
        iVar53 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
        auVar49._4_4_ = iVar8;
        auVar49._0_4_ = iVar8;
        auVar49._8_4_ = iVar53;
        auVar49._12_4_ = iVar53;
        iVar8 = movmskpd(uVar27,auVar49);
        if ((iVar8 != 3) ||
           (iVar53 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
           iVar54 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
           auVar50._4_4_ = iVar53, auVar50._0_4_ = iVar53, auVar50._8_4_ = iVar54,
           auVar50._12_4_ = iVar54, iVar53 = movmskpd((int)puVar19,auVar50), iVar53 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x138,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
        puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
        iVar53 = -(uint)((int)*puVar19 == (int)*puVar18);
        iVar54 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
        auVar51._4_4_ = iVar53;
        auVar51._0_4_ = iVar53;
        auVar51._8_4_ = iVar54;
        auVar51._12_4_ = iVar54;
        uVar9 = movmskpd(iVar8,auVar51);
        uVar29 = (ulong)uVar9;
        if ((uVar9 != 3) ||
           (iVar8 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
           iVar53 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
           auVar52._4_4_ = iVar8, auVar52._0_4_ = iVar8, auVar52._8_4_ = iVar53,
           auVar52._12_4_ = iVar53, iVar8 = movmskpd((int)puVar19,auVar52), iVar8 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x139,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
        fVar46 = *pfVar20;
        pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
        if ((fVar46 != *pfVar20) || (NAN(fVar46) || NAN(*pfVar20))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13a,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
        pfVar21 = (float *)Imf_3_2::Header::screenWindowCenter();
        if ((((*pfVar20 != *pfVar21) || (NAN(*pfVar20) || NAN(*pfVar21))) ||
            (pfVar20[1] != pfVar21[1])) || (NAN(pfVar20[1]) || NAN(pfVar21[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13c,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
        fVar46 = *pfVar20;
        pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
        if ((fVar46 != *pfVar20) || (NAN(fVar46) || NAN(*pfVar20))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13d,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar22 = (int *)Imf_3_2::Header::lineOrder();
        iVar8 = *piVar22;
        piVar22 = (int *)Imf_3_2::Header::lineOrder();
        if (iVar8 != *piVar22) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13e,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar22 = (int *)Imf_3_2::Header::compression();
        iVar8 = *piVar22;
        piVar22 = (int *)Imf_3_2::Header::compression();
        if (iVar8 != *piVar22) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13f,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        this = (ChannelList *)Imf_3_2::Header::channels();
        pCVar23 = (ChannelList *)Imf_3_2::Header::channels();
        cVar7 = Imf_3_2::ChannelList::operator==(this,pCVar23);
        if (cVar7 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x140,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar18 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        puVar19 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        sVar2 = puVar18[1];
        if ((sVar2 != puVar19[1]) ||
           ((sVar2 != 0 && (iVar8 = bcmp((void *)*puVar18,(void *)*puVar19,sVar2), iVar8 != 0)))) {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x141,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar18 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        puVar19 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        sVar2 = puVar18[1];
        if ((sVar2 != puVar19[1]) ||
           ((sVar2 != 0 && (iVar8 = bcmp((void *)*puVar18,(void *)*puVar19,sVar2), iVar8 != 0)))) {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x142,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        bVar44 = false;
      } while (bVar33);
      vStack_330.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_330.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_330.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      local_218 = 0;
      uStack_210 = 0;
      uStack_220 = 0;
      _file = 0;
      local_258 = 0;
      uStack_250 = 0;
      uStack_260 = 0;
      _part = 0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar10 = 0;
      do {
        lVar36 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar10;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar10
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar10) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar10) = lVar36;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar10) = lVar36;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar10) = 0
        ;
        lVar10 = lVar10 + 0x30;
      } while (lVar10 != 0x60);
      iVar8 = 0;
      pFVar43 = frameBuffers;
      pOVar30 = &part;
      pMVar42 = &file;
      pvVar34 = &parts;
      puVar25 = &local_350;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        Imf_3_2::InputPart::InputPart(&part_1,&file_1,iVar8);
        uVar9 = *puVar25;
        if (uVar9 == 2) {
          pcVar12 = (char *)operator_new__(0x194c6);
          if (*(void **)(pOVar30 + 0x10) != (void *)0x0) {
            operator_delete__(*(void **)(pOVar30 + 0x10));
          }
          *(undefined8 *)pOVar30 = 0x107;
          *(undefined8 *)(pOVar30 + 8) = 0xc5;
          *(char **)(pOVar30 + 0x10) = pcVar12;
          Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar12,2,0x18a,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar43,(Slice *)"HALF");
        }
        else if (uVar9 == 1) {
          pcVar12 = (char *)operator_new__(0x3298c);
          if (*(void **)(pMVar42 + 0x10) != (void *)0x0) {
            operator_delete__(*(void **)(pMVar42 + 0x10));
          }
          *(undefined8 *)pMVar42 = 0x107;
          *(undefined8 *)(pMVar42 + 8) = 0xc5;
          *(char **)(pMVar42 + 0x10) = pcVar12;
          Imf_3_2::Slice::Slice((Slice *)&header,FLOAT,pcVar12,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar43,(Slice *)"FLOAT");
        }
        else if (uVar9 == 0) {
          pOVar24 = (pointer)operator_new__(0x3298c);
          pOVar31 = (pvVar34->
                    super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (pOVar31 != (pointer)0x0) {
            operator_delete__(pOVar31);
          }
          (pvVar34->super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x107;
          (pvVar34->super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0xc5;
          (pvVar34->super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar24;
          Imf_3_2::Slice::Slice((Slice *)&header,UINT,(char *)pOVar24,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar43,(Slice *)"UINT");
        }
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&part_1);
        if (parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_2::InputPart,std::allocator<Imf_3_2::InputPart>>::
          _M_realloc_insert<Imf_3_2::InputPart_const&>
                    ((vector<Imf_3_2::InputPart,std::allocator<Imf_3_2::InputPart>> *)&parts_1,
                     (iterator)
                     parts_1.
                     super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part_1);
        }
        else {
          *(undefined8 *)
           parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part_1;
          parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        iVar8 = 1;
        pFVar43 = frameBuffers + 1;
        pOVar30 = (OutputPart *)&uStack_260;
        pMVar42 = (MultiPartOutputFile *)&uStack_220;
        pvVar34 = &vStack_330;
        puVar25 = &local_354;
        bVar44 = false;
      } while (bVar33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading files ",0xe)
      ;
      std::ostream::flush();
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
      pvVar34 = &parts;
      pTVar16 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar16,2);
      iVar8 = 0;
      do {
        pTVar17 = (Task *)operator_new(0x20);
        pIVar5 = parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
        *(undefined ***)pTVar17 = &PTR__Task_001ed330;
        *(pointer *)(pTVar17 + 0x10) = pIVar5;
        *(int *)(pTVar17 + 0x18) = iVar8;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
        pTVar17 = (Task *)operator_new(0x20);
        pIVar5 = parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar17,(TaskGroup *)&header);
        *(undefined ***)pTVar17 = &PTR__Task_001ed330;
        *(pointer *)(pTVar17 + 0x10) = pIVar5 + 8;
        *(int *)(pTVar17 + 0x18) = iVar8;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar16);
        iVar8 = iVar8 + 10;
      } while (iVar8 != 0x10e);
      (**(code **)(*(long *)pTVar16 + 8))(pTVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparing",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      pOVar30 = &part;
      pMVar42 = &file;
      puVar25 = &local_350;
      bVar44 = true;
      do {
        bVar33 = bVar44;
        uVar9 = *puVar25;
        if (uVar9 == 2) {
          lVar10 = *(long *)(pOVar30 + 0x10);
          uVar32 = 0;
          lVar36 = 0;
          uVar29 = 0;
          bVar44 = false;
          do {
            iVar8 = (int)uVar32;
            lVar41 = 0;
            do {
              iVar53 = (int)lVar41;
              fVar46 = (float)(iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53);
              if ((uint)fVar46 < 0x38800000) {
                if ((uint)fVar46 < 0x33000001) {
                  uVar38 = 0;
                }
                else {
                  uVar39 = (uint)fVar46 & 0x7fffff | 0x800000;
                  cVar7 = (char)((uint)fVar46 >> 0x17);
                  uVar9 = uVar39 >> (0x7eU - cVar7 & 0x1f);
                  uVar38 = (ulong)uVar9;
                  if (0x80000000 < uVar39 << (cVar7 + 0xa2U & 0x1f)) {
                    uVar38 = (ulong)(uVar9 + 1);
                  }
                }
              }
              else if ((uint)fVar46 < 0x7f800000) {
                if ((uint)fVar46 < 0x477ff000) {
                  uVar38 = (ulong)((int)fVar46 + 0x8000fff + (uint)(((uint)fVar46 >> 0xd & 1) != 0)
                                  >> 0xd);
                }
                else {
                  uVar38 = 0x7c00;
                }
              }
              else {
                uVar38 = 0x7c00;
                if (fVar46 != INFINITY) {
                  uVar9 = (uint)fVar46 >> 0xd & 0x3ff;
                  uVar38 = (ulong)(uVar9 == 0 | uVar9 | 0x7c00);
                }
              }
              fVar46 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar10 + lVar41 * 2) * 4);
              pfVar20 = (float *)(_imath_half_to_float_table + (uVar38 & 0xffff) * 4);
              if ((fVar46 != *pfVar20) || (NAN(fVar46) || NAN(*pfVar20))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar53);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar29);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
                poVar11 = (ostream *)
                          operator<<(poVar11,(half)*(uint16_t *)
                                                    (lVar36 * *(long *)(pOVar30 + 8) +
                                                     *(long *)(pOVar30 + 0x10) + lVar41 * 2));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", should be ",0xc);
                plVar26 = (long *)std::ostream::operator<<
                                            (poVar11,iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53
                                            );
                std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
                std::ostream::put((char)plVar26);
                std::ostream::flush();
                std::ostream::flush();
                if (!bVar44) {
                  __assert_fail("checkPixels<half> (hData[i], width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                                ,0x17d,
                                "void (anonymous namespace)::readFiles(int *, const std::string &)")
                  ;
                }
                goto LAB_0018b69c;
              }
              lVar41 = lVar41 + 1;
              uVar32 = (ulong)((int)uVar32 + 1);
            } while (lVar41 != 0xc5);
            bVar44 = 0x105 < uVar29;
            uVar29 = uVar29 + 1;
            lVar36 = lVar36 + 2;
            uVar32 = (ulong)(iVar8 + 0xc5);
            lVar10 = lVar10 + *(long *)(pOVar30 + 8) * 2;
          } while (uVar29 != 0x107);
        }
        else if (uVar9 == 1) {
          lVar10 = *(long *)(pMVar42 + 0x10);
          uVar32 = 0;
          lVar36 = 0;
          uVar29 = 0;
          bVar44 = false;
          do {
            iVar8 = (int)uVar32;
            lVar41 = 0;
            do {
              iVar53 = (int)lVar41;
              fVar45 = (float)(iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53);
              fVar46 = *(float *)(lVar10 + lVar41 * 4);
              if ((fVar46 != fVar45) || (NAN(fVar46) || NAN(fVar45))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar53);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar29);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
                poVar11 = std::ostream::_M_insert<double>
                                    ((double)*(float *)(lVar36 * *(long *)(pMVar42 + 8) +
                                                        *(long *)(pMVar42 + 0x10) + lVar41 * 4));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", should be ",0xc);
                plVar26 = (long *)std::ostream::operator<<
                                            (poVar11,iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53
                                            );
                std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
                std::ostream::put((char)plVar26);
                std::ostream::flush();
                std::ostream::flush();
                if (!bVar44) {
                  __assert_fail("checkPixels<float> (fData[i], width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                                ,0x17b,
                                "void (anonymous namespace)::readFiles(int *, const std::string &)")
                  ;
                }
                goto LAB_0018b69c;
              }
              lVar41 = lVar41 + 1;
              uVar32 = (ulong)((int)uVar32 + 1);
            } while (lVar41 != 0xc5);
            bVar44 = 0x105 < uVar29;
            uVar29 = uVar29 + 1;
            lVar36 = lVar36 + 4;
            uVar32 = (ulong)(iVar8 + 0xc5);
            lVar10 = lVar10 + *(long *)(pMVar42 + 8) * 4;
          } while (uVar29 != 0x107);
        }
        else if (uVar9 == 0) {
          pOVar31 = (pvVar34->
                    super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar32 = 0;
          uVar29 = 0;
          bVar44 = false;
          do {
            iVar8 = (int)uVar32;
            lVar10 = 0;
            do {
              iVar53 = (int)lVar10;
              if (iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53 != *(int *)(pOVar31 + lVar10 * 4))
              {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar11 = (ostream *)std::ostream::operator<<(&std::cout,iVar53);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar29);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,": ",2);
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,", should be ",0xc);
                plVar26 = (long *)std::ostream::operator<<
                                            (poVar11,iVar8 + (int)(uVar32 / 0x801) * -0x801 + iVar53
                                            );
                std::ios::widen((char)*(undefined8 *)(*plVar26 + -0x18) + (char)plVar26);
                std::ostream::put((char)plVar26);
                std::ostream::flush();
                std::ostream::flush();
                if (!bVar44) {
                  __assert_fail("checkPixels<unsigned int> (uData[i], width, height)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                                ,0x178,
                                "void (anonymous namespace)::readFiles(int *, const std::string &)")
                  ;
                }
                goto LAB_0018b69c;
              }
              lVar10 = lVar10 + 1;
              uVar32 = (ulong)((int)uVar32 + 1);
            } while (lVar10 != 0xc5);
            bVar44 = 0x105 < uVar29;
            uVar29 = uVar29 + 1;
            uVar32 = (ulong)(iVar8 + 0xc5);
            pOVar31 = pOVar31 + (long)(pvVar34->
                                      super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                                      )._M_impl.super__Vector_impl_data._M_finish * 4;
          } while (uVar29 != 0x107);
        }
LAB_0018b69c:
        pOVar30 = (OutputPart *)&uStack_260;
        pMVar42 = (MultiPartOutputFile *)&uStack_220;
        pvVar34 = &vStack_330;
        puVar25 = &local_354;
        bVar44 = false;
      } while (bVar33);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar10 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar10));
        lVar10 = lVar10 + -0x30;
      } while (lVar10 != -0x30);
      if (parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts_1.
                        super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)parts_1.
                              super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts_1.
                              super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar10 = 0x30;
      do {
        if (*(void **)((long)&uStack_280 + lVar10) != (void *)0x0) {
          operator_delete__(*(void **)((long)&uStack_280 + lVar10));
        }
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0);
      lVar10 = 0x30;
      do {
        if (*(void **)((long)&local_240 + lVar10) != (void *)0x0) {
          operator_delete__(*(void **)((long)&local_240 + lVar10));
        }
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0);
      lVar10 = 0x30;
      do {
        if (*(void **)((long)&local_350 + lVar10) != (void *)0x0) {
          operator_delete__(*(void **)((long)&local_350 + lVar10));
        }
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&file_1);
      remove(fn._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      lVar10 = -0x40;
      plVar26 = local_1c8;
      do {
        if (plVar26 != (long *)plVar26[-2]) {
          operator_delete((long *)plVar26[-2],*plVar26 + 1);
        }
        plVar26 = plVar26 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fn._M_dataplus._M_p != &fn.field_2) {
        operator_delete(fn._M_dataplus._M_p,fn.field_2._M_allocated_capacity + 1);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != 3);
    local_34c = local_34c + 1;
    if (local_34c == 3) {
      iVar8 = IlmThread_3_2::ThreadPool::globalThreadPool();
      IlmThread_3_2::ThreadPool::setNumThreads(iVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testMultiScanlinePartThreading (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the two threads reading/writing on two-scanline-part file"
            << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        int pixelTypes[2];

        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
            {
                pixelTypes[0] = i;
                pixelTypes[1] = j;
                testWriteRead (pixelTypes, tempDir);
            }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}